

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

void __thiscall
boost::xpressive::cpp_regex_traits<char>::cpp_regex_traits
          (cpp_regex_traits<char> *this,locale_type *loc)

{
  locale *in_RSI;
  void *in_RDI;
  locale_type *unaff_retaddr;
  cpp_regex_traits<char> *in_stack_00000008;
  locale local_20 [8];
  locale local_18 [8];
  locale *local_10;
  
  local_10 = in_RSI;
  memset(in_RDI,0,0x200);
  std::locale::locale((locale *)((long)in_RDI + 0x200));
  std::locale::locale(local_20,local_10);
  imbue(in_stack_00000008,unaff_retaddr);
  std::locale::~locale(local_18);
  std::locale::~locale(local_20);
  return;
}

Assistant:

cpp_regex_traits(locale_type const &loc = locale_type())
      : base_type()
      , loc_()
    {
        this->imbue(loc);
    }